

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

int matchone(regex_t p,char c)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = p._0_4_ & 0xff;
  switch(uVar2) {
  case 1:
    goto switchD_001110a5_caseD_1;
  default:
    bVar3 = (p.field_1._0_4_ & 0xff) == (int)c;
    break;
  case 8:
    iVar1 = matchcharclass(c,(char *)p.field_1.ccl);
    return iVar1;
  case 9:
    uVar2 = matchcharclass(c,(char *)p.field_1.ccl);
    goto LAB_001110cb;
  case 10:
    bVar3 = (byte)(c - 0x30U) < 10;
    goto LAB_001110ff;
  case 0xb:
    bVar3 = (byte)(c - 0x3aU) < 0xf6;
LAB_001110ff:
    return (uint)bVar3;
  case 0xc:
    iVar1 = matchalphanum(c);
    return iVar1;
  case 0xd:
    uVar2 = matchalphanum(c);
LAB_001110cb:
    return uVar2 ^ 1;
  case 0xe:
    if (((uint)(int)c < 0x21) && ((0x100003600U >> ((ulong)(uint)(int)c & 0x3f) & 1) != 0)) {
      return 1;
    }
    bVar3 = c == '\v';
    break;
  case 0xf:
    if ((0x20 < (uint)(int)c) ||
       (uVar2 = 0, (0x100003600U >> ((ulong)(uint)(int)c & 0x3f) & 1) == 0)) {
      uVar2 = (uint)(c != '\v');
    }
    goto switchD_001110a5_caseD_1;
  }
  uVar2 = (uint)bVar3;
switchD_001110a5_caseD_1:
  return uVar2;
}

Assistant:

static int matchone(regex_t p, char c)
{
  switch (p.type)
  {
    case DOT:            return 1;
    case CHAR_CLASS:     return  matchcharclass(c, (const char*)p.ccl);
    case INV_CHAR_CLASS: return !matchcharclass(c, (const char*)p.ccl);
    case DIGIT:          return  matchdigit(c);
    case NOT_DIGIT:      return !matchdigit(c);
    case ALPHA:          return  matchalphanum(c);
    case NOT_ALPHA:      return !matchalphanum(c);
    case WHITESPACE:     return  matchwhitespace(c);
    case NOT_WHITESPACE: return !matchwhitespace(c);
    default:             return  (p.ch == c);
  }
}